

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipstats.cpp
# Opt level: O0

int HyperLogLog::TrailingZeroes(uint64_t fnv64)

{
  byte local_29;
  ulong uStack_28;
  uint8_t v;
  size_t i;
  uint64_t v64;
  int nb_zeroes;
  uint64_t fnv64_local;
  
  v64._4_4_ = 0;
  uStack_28 = 0;
  i = fnv64;
  while( true ) {
    if (7 < uStack_28) {
      return v64._4_4_;
    }
    local_29 = (byte)i;
    if (local_29 != 0) break;
    v64._4_4_ = v64._4_4_ + 8;
    i = i >> 8;
    uStack_28 = uStack_28 + 1;
  }
  if ((i & 0xf) == 0) {
    v64._4_4_ = v64._4_4_ + 4;
    local_29 = (byte)((int)(uint)local_29 >> 4);
  }
  if ((local_29 & 3) == 0) {
    v64._4_4_ = v64._4_4_ + 2;
    local_29 = (byte)((int)(uint)local_29 >> 2);
  }
  if ((local_29 & 1) != 0) {
    return v64._4_4_;
  }
  return v64._4_4_ + 1;
}

Assistant:

int HyperLogLog::TrailingZeroes(uint64_t fnv64)
{
    int nb_zeroes = 0;
    uint64_t v64 = fnv64;
    for (size_t i = 0; i < 8; i++) {
        uint8_t v = (uint8_t)(v64 & 0xff);
        if (v == 0) {
            nb_zeroes += 8;
            v64 >>= 8;
            continue;
        }
        else {
            if ((v&0xf) == 0) {
                nb_zeroes += 4;
                v >>= 4;
            }
            if ((v&0x3) == 0) {
                nb_zeroes += 2;
                v >>= 2;
            }
            if ((v&0x1)== 0) {
                nb_zeroes += 1;
            }
            break;
        }
    }
    return nb_zeroes;
}